

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithru.c
# Opt level: O0

int main(int argc,char **argv)

{
  PmError PVar1;
  uint local_24;
  int local_20;
  PmEvent buffer;
  PmTimestamp last_time;
  char **argv_local;
  int argc_local;
  
  buffer.message = 0;
  unique0x100000e0 = argv;
  printf("begin PortMidi midithru program...\n");
  initialize();
  printf("%s\n%s\n","This program will run for 60 seconds, or until you play middle C,",
         "echoing all input with a 2 second delay.");
  while (current_timestamp < 60000) {
    buffer.message = buffer.message + 500;
    do {
    } while (current_timestamp < buffer.message);
    while (PVar1 = Pm_Dequeue(in_queue,&local_24), PVar1 == pmGotData) {
      local_20 = local_20 + 2000;
      Pm_Enqueue(out_queue,&local_24);
      if (((local_24 & 0xff) == 0x90) && (((int)local_24 >> 8 & 0xffU) == 0x3c)) goto LAB_00102c29;
    }
  }
LAB_00102c29:
  finalize();
  exit_with_message("finished PortMidi midithru program.");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    PmTimestamp last_time = 0;
    PmEvent buffer;

    /* determine what type of test to run */
    printf("begin PortMidi midithru program...\n");

    initialize(); /* set up and start midi processing */
	
    printf("%s\n%s\n",
           "This program will run for 60 seconds, or until you play middle C,",
           "echoing all input with a 2 second delay.");

    while (current_timestamp < 60000) {
        /* just to make the point that this is not a low-latency process,
           spin until half a second has elapsed */
        last_time = last_time + 500;
        while (last_time > current_timestamp) ;

        /* now read data and send it after changing timestamps */
        while (Pm_Dequeue(in_queue, &buffer) == 1) {
            /* printf("timestamp %d\n", buffer.timestamp); */
            /* printf("message %x\n", buffer.message); */
            buffer.timestamp = buffer.timestamp + 2000; /* delay */
            Pm_Enqueue(out_queue, &buffer);
            /* play middle C to break out of loop */
            if (Pm_MessageStatus(buffer.message) == 0x90 &&
                Pm_MessageData1(buffer.message) == 60) {
                goto quit_now;
            }
        }
    }
quit_now:
    finalize();
    exit_with_message("finished PortMidi midithru program.");
    return 0; /* never executed, but keeps the compiler happy */
}